

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined4 *puVar3;
  uint uVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  undefined1 *puVar22;
  long lVar23;
  unsigned_long uVar24;
  ulong uVar25;
  float *pfVar26;
  uint *puVar27;
  long lVar28;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  ulong local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  PrimRef *local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [8];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [8];
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [8];
  long local_58;
  CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>
  *local_50;
  uint local_48 [6];
  
  uVar19 = range->_begin;
  uVar17 = range->_end;
  if (uVar19 < uVar17) {
    puVar22 = (undefined1 *)((long)&prims[uVar19].lower.field_0 + 0xc);
    do {
      puVar22[3] = puVar22[3] & 7;
      uVar19 = uVar19 + 1;
      uVar17 = range->_end;
      puVar22 = puVar22 + 0x20;
    } while (uVar19 < uVar17);
  }
  uVar24 = range->_begin;
  uVar19 = (uVar17 - uVar24) + 3;
  local_f0 = uVar19 >> 2;
  local_108 = local_f0 * 0xb0;
  this_00 = (alloc.talloc1)->parent;
  local_f8 = prims;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_e8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_88 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,(ThreadLocal2 **)&local_88);
    }
    else {
      *__position._M_current = local_88;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)uStack_e0 == '\x01') {
      MutexSys::unlock(local_e8);
    }
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_108;
  sVar21 = (alloc.talloc1)->cur;
  uVar25 = (ulong)(-(int)sVar21 & 0xf);
  uVar17 = sVar21 + local_108 + uVar25;
  (alloc.talloc1)->cur = uVar17;
  if ((alloc.talloc1)->end < uVar17) {
    (alloc.talloc1)->cur = sVar21;
    if ((alloc.talloc1)->allocBlockSize < local_108 << 2) {
      pcVar18 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_108);
    }
    else {
      local_e8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
      pcVar18 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
      (alloc.talloc1)->ptr = pcVar18;
      sVar21 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar21;
      (alloc.talloc1)->cur = 0;
      (alloc.talloc1)->end = (size_t)local_e8;
      (alloc.talloc1)->cur = local_108;
      if (local_e8 < local_108) {
        (alloc.talloc1)->cur = 0;
        local_e8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
        (alloc.talloc1)->ptr = pcVar18;
        sVar21 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar21;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = (size_t)local_e8;
        (alloc.talloc1)->cur = local_108;
        if (local_e8 < local_108) {
          (alloc.talloc1)->cur = 0;
          pcVar18 = (char *)0x0;
        }
        else {
          (alloc.talloc1)->bytesWasted = sVar21;
        }
      }
      else {
        (alloc.talloc1)->bytesWasted = sVar21;
      }
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar25;
    pcVar18 = (alloc.talloc1)->ptr + (uVar17 - local_108);
  }
  if (3 < uVar19) {
    lVar20 = local_f0 + (local_f0 == 0);
    local_f8 = (PrimRef *)((long)&(local_f8->upper).field_0 + 0xc);
    lVar23 = 0;
    local_58 = lVar20;
    local_50 = this;
    do {
      uVar19 = range->_end;
      local_108 = 0xffffffffffffffff;
      uStack_100 = 0xffffffff;
      uStack_fc = 0xffffffff;
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      local_d8[4] = 0.0;
      local_d8[5] = 0.0;
      local_d8[6] = 0.0;
      local_d8[7] = 0.0;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      local_d8[3] = 0.0;
      local_e8 = (MutexSys *)0x0;
      uStack_e0 = 0;
      local_a8[4] = 0.0;
      local_a8[5] = 0.0;
      local_a8[6] = 0.0;
      local_a8[7] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_78[4] = 0.0;
      local_78[5] = 0.0;
      local_78[6] = 0.0;
      local_78[7] = 0.0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      local_88 = (ThreadLocal2 *)0x0;
      uStack_80 = 0;
      if (uVar24 < uVar19) {
        lVar20 = *(long *)(*(long *)(*(long *)this + 0x68) + 0x1e8);
        puVar27 = (uint *)((long)local_f8 + uVar24 * 0x20);
        uVar17 = 0;
        do {
          uVar4 = *puVar27;
          lVar5 = *(long *)(lVar20 + (ulong)puVar27[-4] * 8);
          lVar28 = (ulong)uVar4 * *(long *)(lVar5 + 0x68);
          lVar6 = *(long *)(lVar5 + 0x58);
          lVar7 = *(long *)(lVar5 + 0x90);
          lVar5 = *(long *)(lVar5 + 0xa0);
          puVar3 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + lVar28) * lVar5);
          uVar8 = *puVar3;
          fVar9 = (float)puVar3[1];
          fVar10 = (float)puVar3[2];
          puVar3 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 4 + lVar28) * lVar5);
          uVar11 = *puVar3;
          fVar12 = (float)puVar3[1];
          fVar13 = (float)puVar3[2];
          puVar3 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 8 + lVar28) * lVar5);
          uVar14 = *puVar3;
          fVar15 = (float)puVar3[1];
          fVar16 = (float)puVar3[2];
          *(uint *)((long)&local_108 + uVar17 * 4) = puVar27[-4];
          local_48[uVar17] = uVar4;
          *(undefined4 *)((long)&local_e8 + uVar17 * 4) = uVar8;
          local_d8[uVar17] = fVar9;
          local_d8[uVar17 + 4] = fVar10;
          *(undefined4 *)((long)&local_b8 + uVar17 * 4) = uVar11;
          local_a8[uVar17] = fVar12;
          local_a8[uVar17 + 4] = fVar13;
          *(undefined4 *)((long)&local_88 + uVar17 * 4) = uVar14;
          local_78[uVar17] = fVar15;
          local_78[uVar17 + 4] = fVar16;
          uVar25 = uVar17 + 1;
          if (2 < uVar17) break;
          lVar5 = uVar17 + uVar24;
          puVar27 = puVar27 + 8;
          uVar17 = uVar25;
        } while (lVar5 + 1U < uVar19);
        uVar24 = uVar24 + uVar25;
        lVar20 = local_58;
        this = local_50;
      }
      pfVar26 = (float *)(pcVar18 + lVar23 * 0xb0);
      *pfVar26 = (float)local_e8;
      pfVar26[1] = local_e8._4_4_;
      pfVar26[2] = (float)uStack_e0;
      pfVar26[3] = uStack_e0._4_4_;
      pfVar26[4] = local_d8[0];
      pfVar26[5] = local_d8[1];
      pfVar26[6] = local_d8[2];
      pfVar26[7] = local_d8[3];
      pfVar26[8] = local_d8[4];
      pfVar26[9] = local_d8[5];
      pfVar26[10] = local_d8[6];
      pfVar26[0xb] = local_d8[7];
      pfVar26[0xc] = (float)local_e8 - (float)local_b8;
      pfVar26[0xd] = local_e8._4_4_ - local_b8._4_4_;
      pfVar26[0xe] = (float)uStack_e0 - (float)uStack_b0;
      pfVar26[0xf] = uStack_e0._4_4_ - uStack_b0._4_4_;
      pfVar26[0x10] = local_d8[0] - local_a8[0];
      pfVar26[0x11] = local_d8[1] - local_a8[1];
      pfVar26[0x12] = local_d8[2] - local_a8[2];
      pfVar26[0x13] = local_d8[3] - local_a8[3];
      pfVar26[0x14] = local_d8[4] - local_a8[4];
      pfVar26[0x15] = local_d8[5] - local_a8[5];
      pfVar26[0x16] = local_d8[6] - local_a8[6];
      pfVar26[0x17] = local_d8[7] - local_a8[7];
      pfVar26[0x18] = (float)local_88 - (float)local_e8;
      pfVar26[0x19] = local_88._4_4_ - local_e8._4_4_;
      pfVar26[0x1a] = (float)uStack_80 - (float)uStack_e0;
      pfVar26[0x1b] = uStack_80._4_4_ - uStack_e0._4_4_;
      pfVar26[0x1c] = local_78[0] - local_d8[0];
      pfVar26[0x1d] = local_78[1] - local_d8[1];
      pfVar26[0x1e] = local_78[2] - local_d8[2];
      pfVar26[0x1f] = local_78[3] - local_d8[3];
      pfVar26[0x20] = local_78[4] - local_d8[4];
      pfVar26[0x21] = local_78[5] - local_d8[5];
      pfVar26[0x22] = local_78[6] - local_d8[6];
      pfVar26[0x23] = local_78[7] - local_d8[7];
      *(ulong *)(pfVar26 + 0x24) = local_108;
      *(ulong *)(pfVar26 + 0x26) = CONCAT44(uStack_fc,uStack_100);
      *(ulong *)(pfVar26 + 0x28) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pfVar26 + 0x2a) = CONCAT44(local_48[3],local_48[2]);
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar20);
  }
  uVar19 = 7;
  if (local_f0 < 7) {
    uVar19 = local_f0;
  }
  return (NodeRefPtr<4>)(uVar19 | (ulong)pcVar18 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }